

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

void mxx::impl::
     samplesort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>,false>
               (TwoBSA<unsigned_long> *begin,TwoBSA<unsigned_long> *end,comm *param_3,comm *param_4)

{
  int p_00;
  bool bVar1;
  int rank;
  unsigned_long uVar2;
  unsigned_long uVar3;
  iterator __first;
  unsigned_long_long __n;
  reference msgs;
  reference out;
  iterator iVar4;
  iterator iVar5;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  local_1b8;
  allocator<TwoBSA<unsigned_long>_> local_1a9;
  undefined1 local_1a8 [8];
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> recv_elements;
  size_t recv_n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  undefined1 local_130 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> local_100;
  TwoBSA<unsigned_long> *local_e0;
  TwoBSA<unsigned_long> *local_d8;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> local_d0;
  undefined1 local_b8 [8];
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> local_splitters;
  undefined1 local_88 [7];
  bool _AssumeBlockDecomp;
  block_decomposition<unsigned_long> mypart;
  size_t global_size;
  unsigned_long local_58;
  size_t local_size;
  int s;
  TwoBSA<unsigned_long> *local_40;
  int local_34;
  comm *pcStack_30;
  int p;
  comm *comm_local;
  MPI_Datatype mpi_dt_local;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  local_18;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  end_local;
  __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
  begin_local;
  
  pcStack_30 = param_4;
  comm_local = param_3;
  local_18._M_current = end;
  end_local._M_current = begin;
  local_34 = mxx::comm::size(param_4);
  local_40 = end_local._M_current;
  _s = local_18._M_current;
  std::
  sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
            (end_local._M_current,local_18._M_current);
  if (local_34 != 1) {
    local_size._0_4_ = local_34 + -1;
    local_58 = std::
               distance<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
                         (end_local,local_18);
    uVar2 = allreduce<unsigned_long>(&local_58,pcStack_30);
    p_00 = local_34;
    mypart._16_8_ = uVar2;
    rank = mxx::comm::rank(pcStack_30);
    partition::block_decomposition<unsigned_long>::block_decomposition
              ((block_decomposition<unsigned_long> *)local_88,uVar2,p_00,rank);
    uVar2 = local_58;
    uVar3 = partition::block_decomposition<unsigned_long>::local_size
                      ((block_decomposition<unsigned_long> *)local_88);
    bVar1 = all_of(uVar2 == uVar3,pcStack_30);
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
              ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)local_b8);
    if (bVar1) {
      local_d8 = end_local._M_current;
      local_e0 = local_18._M_current;
      sample_block_decomp<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
                (&local_d0,(impl *)end_local._M_current,local_18._M_current,(int)local_size,
                 pcStack_30,comm_local);
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator=
                ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)local_b8,
                 &local_d0);
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::~vector
                (&local_d0);
    }
    else {
      sample_arbit_decomp<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
                (&local_100,(impl *)end_local._M_current,local_18._M_current,(int)local_size,
                 pcStack_30,comm_local);
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::operator=
                ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)local_b8,
                 &local_100);
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::~vector
                (&local_100);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130);
    split<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
              (&local_148,(impl *)end_local._M_current,local_18._M_current,local_b8,pcStack_30);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130,&local_148);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_148);
    all2all<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_n,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130,pcStack_30);
    __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_n);
    recv_elements.super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_n);
    __n = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_long>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__first._M_current,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )recv_elements.
                       super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    if (((bVar1) && (2 < local_58)) && (local_58 * 2 < __n)) {
      assert_fail("!_AssumeBlockDecomp || (local_size <= 2 || recv_n <= 2* local_size)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                  ,0x193,"samplesort");
    }
    std::allocator<TwoBSA<unsigned_long>_>::allocator(&local_1a9);
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::vector
              ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)local_1a8,
               __n,&local_1a9);
    std::allocator<TwoBSA<unsigned_long>_>::~allocator(&local_1a9);
    msgs = __gnu_cxx::
           __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
           ::operator*(&end_local);
    local_1b8._M_current =
         (TwoBSA<unsigned_long> *)
         std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::begin
                   ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                    local_1a8);
    out = __gnu_cxx::
          __normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
          ::operator*(&local_1b8);
    all2allv<TwoBSA<unsigned_long>>
              (msgs,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130,out,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_n,pcStack_30);
    iVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::begin
                      ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                       local_1a8);
    iVar5 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::end
                      ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                       local_1a8);
    std::
    sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
              (iVar4._M_current,iVar5._M_current);
    if (bVar1) {
      iVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::begin
                        ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                         local_1a8);
      iVar5 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::end
                        ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                         local_1a8);
      stable_distribute<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
                ((__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                  )iVar4._M_current,
                 (__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                  )iVar5._M_current,end_local,pcStack_30);
    }
    else {
      iVar4 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::begin
                        ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                         local_1a8);
      iVar5 = std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::end
                        ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)
                         local_1a8);
      redo_arbit_decomposition<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>>
                ((__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                  )iVar4._M_current,
                 (__normal_iterator<TwoBSA<unsigned_long>_*,_std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>_>
                  )iVar5._M_current,end_local,local_58,pcStack_30);
    }
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::~vector
              ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)local_1a8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&recv_n);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_130);
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::~vector
              ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)local_b8);
    partition::block_decomposition<unsigned_long>::~block_decomposition
              ((block_decomposition<unsigned_long> *)local_88);
  }
  return;
}

Assistant:

void samplesort(_Iterator begin, _Iterator end, _Compare comp, MPI_Datatype mpi_dt, const mxx::comm& comm) {
    // get value type of underlying data
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;

    int p = comm.size();

    SS_TIMER_START(comm);

    // perform local (stable) sorting
    if (_Stable)
        std::stable_sort(begin, end, comp);
    else
        std::sort(begin, end, comp);

    // sequential case: we're done
    if (p == 1)
        return;

#if SS_ENABLE_TIMER
    MPI_Barrier(comm);
#endif
    SS_TIMER_END_SECTION("local_sort");


    // number of samples
    int s = p-1;
    // local size
    std::size_t local_size = std::distance(begin, end);

    // check if we have a perfect block decomposition
    std::size_t global_size = mxx::allreduce(local_size, comm);
    partition::block_decomposition<std::size_t> mypart(global_size, p, comm.rank());
    bool _AssumeBlockDecomp = mxx::all_of(local_size == mypart.local_size(), comm);

    // sample sort
    // 1. pick `s` samples on each processor
    // 2. gather to `rank=0`
    // 3. local sort on master
    // 4. broadcast the p-1 final splitters
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears twice, then split evenly)
    //    => send_counts
    // 6. distribute send_counts with all2all to get recv_counts
    // 7. allocate enough space (may be more than previously allocated) for receiving
    // 8. all2allv
    // 9. local reordering (multiway-merge or again std::sort)
    // A. equalizing distribution into original size (e.g.,block decomposition)
    //    by sending elements to neighbors

    // get splitters, using the method depending on whether the input consists
    // of arbitrary decompositions or not
    std::vector<value_type> local_splitters;
    if(_AssumeBlockDecomp)
        local_splitters = sample_block_decomp(begin, end, comp, s, comm, mpi_dt);
    else
        local_splitters = sample_arbit_decomp(begin, end, comp, s, comm, mpi_dt);
    SS_TIMER_END_SECTION("get_splitters");

    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    std::vector<size_t> send_counts;
    if (_Stable)
        send_counts = stable_split(begin, end, comp, local_splitters, comm);
    else
        send_counts = split(begin, end, comp, local_splitters, comm);
    SS_TIMER_END_SECTION("send_counts");


    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    std::size_t recv_n = std::accumulate(recv_counts.begin(), recv_counts.end(), 0ull);
    MXX_ASSERT(!_AssumeBlockDecomp || (local_size <= 2 || recv_n <= 2* local_size));
    std::vector<value_type> recv_elements(recv_n);
    // TODO: use collective with iterators [begin,end) instead of pointers!
    mxx::all2allv(&(*begin), send_counts, &(*recv_elements.begin()), recv_counts, comm);
    SS_TIMER_END_SECTION("all2all");

    // 9. local reordering
    /* multiway-merge (using the implementation in __gnu_parallel) */
#ifdef MXX_USE_GCC_MULTIWAY_MERGE
    if (!_Stable && local_size > (size_t)p*p) {
        // prepare the sequence offsets
        typedef typename std::vector<value_type>::iterator val_it;
        std::vector<std::pair<val_it, val_it> > seqs(p);
        std::vector<size_t> recv_displs = mxx::impl::get_displacements(recv_counts);
        for (int i = 0; i < p; ++i) {
            seqs[i].first = recv_elements.begin() + recv_displs[i];
            seqs[i].second = seqs[i].first + recv_counts[i];
        }
        val_it start_merge_it = recv_elements.begin();

        std::size_t merge_n = local_size;
        value_type* merge_buf_begin = &(*begin);
        std::vector<value_type> merge_buf;
        // TODO: reasonable values for the buffer?
        // currently: at least 1/10 th of the size to merge or 1 MiB
        if (local_size == 0 || local_size < recv_n / 10)
        {
            // at least 1MB buffer
            merge_n = std::max<std::size_t>(recv_n / 10, (1024*1024)/sizeof(value_type));
            merge_buf.resize(merge_n);
            merge_buf_begin = &merge_buf[0];
        }
        for (; recv_n > 0;)
        {
            if (recv_n < merge_n)
                merge_n = recv_n;
            // i)   merge at most `local_size` many elements sequentially
            __gnu_parallel::sequential_tag seq_tag;
            __gnu_parallel::multiway_merge(seqs.begin(), seqs.end(), merge_buf_begin, merge_n, comp, seq_tag);

            // ii)  compact the remaining elements in `recv_elements`
            for (int i = p-1; i > 0; --i)
            {
                seqs[i-1].first = std::copy_backward(seqs[i-1].first, seqs[i-1].second, seqs[i].first);
                seqs[i-1].second = seqs[i].first;
            }
            // iii) copy the output buffer `local_size` elements back into
            //      `recv_elements`
            start_merge_it = std::copy(merge_buf_begin, merge_buf_begin + merge_n, start_merge_it);
            assert(start_merge_it == seqs[0].first);

            // reduce the number of elements to be merged
            recv_n -= merge_n;
        }
        // clean up
        merge_buf.clear(); merge_buf.shrink_to_fit();
    } else
#endif
    {
        if (_Stable)
            std::stable_sort(recv_elements.begin(), recv_elements.end(), comp);
        else
            std::sort(recv_elements.begin(), recv_elements.end(), comp);
    }

#if SS_ENABLE_TIMER
    MPI_Barrier(comm);
#endif
    SS_TIMER_END_SECTION("local_merge");

    // A. equalizing distribution into original size (e.g.,block decomposition)
    //    by elements to neighbors
    //    and save elements into the original iterator positions
    if (_AssumeBlockDecomp)
        stable_distribute(recv_elements.begin(), recv_elements.end(), begin, comm);
    else
        redo_arbit_decomposition(recv_elements.begin(), recv_elements.end(), begin, local_size, comm);

    SS_TIMER_END_SECTION("fix_partition");
}